

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

int Acb_NtkCountRoots(Vec_Int_t *vWinObjs,int PivotVar)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = PivotVar + 1;
  iVar1 = 0;
  if ((int)uVar2 < vWinObjs->nSize) {
    iVar1 = 0;
    do {
      if (PivotVar < -1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vWinObjs->pArray[uVar2] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      iVar1 = iVar1 + (vWinObjs->pArray[uVar2] & 1U);
      uVar2 = uVar2 + 1;
    } while (vWinObjs->nSize != uVar2);
  }
  return iVar1;
}

Assistant:

int Acb_NtkCountRoots( Vec_Int_t * vWinObjs, int PivotVar )
{
    int i, iObjLit, nRoots = 0;
    Vec_IntForEachEntryStart( vWinObjs, iObjLit, i, PivotVar + 1 )
        nRoots += Abc_LitIsCompl(iObjLit);
    return nRoots;
}